

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  char *in_RDX;
  Int32 IVar2;
  _Alloc_hider _Var3;
  Int32 result;
  string env_var;
  Int32 local_6c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_60;
  string local_40;
  
  FlagToEnvVar_abi_cxx11_(&local_40,(internal *)flag,in_RDX);
  _Var3._M_p = local_40._M_dataplus._M_p;
  str = getenv(local_40._M_dataplus._M_p);
  IVar2 = default_value;
  if (str != (char *)0x0) {
    local_6c = default_value;
    Message::Message((Message *)&local_60);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_dataplus._M_p + 0x10),"Environment variable ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_60._M_dataplus._M_p + 0x10),local_40._M_dataplus._M_p,
               local_40._M_string_length);
    bVar1 = ParseInt32((Message *)&local_60,str,&local_6c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_60._M_dataplus._M_p + 8))();
    }
    _Var3._M_p = local_40._M_dataplus._M_p;
    IVar2 = local_6c;
    if (!bVar1) {
      Message::Message((Message *)&local_68);
      std::ostream::operator<<((ostream *)(local_68.ptr_ + 0x10),default_value);
      StringStreamToString(&local_60,local_68.ptr_);
      printf("The default value %s is used.\n",local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      if (local_68.ptr_ != (stringstream *)0x0) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      fflush(_stdout);
      _Var3._M_p = local_40._M_dataplus._M_p;
      IVar2 = default_value;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_40.field_2) {
    operator_delete(_Var3._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return IVar2;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}